

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MixSegment.hpp
# Opt level: O1

void __thiscall
cppjieba::MixSegment::MixSegment(MixSegment *this,DictTrie *dictTrie,HMMModel *model)

{
  SegmentBase::SegmentBase((SegmentBase *)this);
  (this->super_SegmentTagged).super_SegmentBase._vptr_SegmentBase =
       (_func_int **)&PTR__MixSegment_00118cd8;
  MPSegment::MPSegment(&this->mpSeg_,dictTrie);
  SegmentBase::SegmentBase(&(this->hmmSeg_).super_SegmentBase);
  (this->hmmSeg_).super_SegmentBase._vptr_SegmentBase = (_func_int **)&PTR__HMMSegment_00118c98;
  (this->hmmSeg_).model_ = model;
  (this->hmmSeg_).isNeedDestroy_ = false;
  return;
}

Assistant:

MixSegment(const DictTrie* dictTrie, const HMMModel* model) 
    : mpSeg_(dictTrie), hmmSeg_(model) {
  }